

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O3

bool __thiscall ON_Brep::SetVertexTolerance(ON_Brep *this,ON_BrepVertex *vertex,bool bLazySet)

{
  ON_3dPoint *this_00;
  int iVar1;
  uint uVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  ON_Curve *pOVar6;
  double *pdVar7;
  ON_Surface *this_01;
  ON_BrepEdge *this_02;
  bool bVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  ON_BrepTrim *pOVar12;
  double dVar13;
  double dVar14;
  ON_Interval local_68;
  ON_Interval local_58;
  ON_3dPoint local_48;
  
  dVar14 = vertex->m_tolerance;
  if (dVar14 < 0.0 || !bLazySet) {
    lVar4 = (long)(vertex->m_ei).m_count;
    if (lVar4 < 1) {
      vertex->m_tolerance = 0.0;
      dVar14 = 0.0;
    }
    else {
      vertex->m_tolerance = -1.23432101234321e+308;
      ON_Interval::ON_Interval(&local_68);
      iVar1 = vertex->m_vertex_index;
      this_00 = &(vertex->super_ON_Point).point;
      dVar14 = 0.0;
      lVar10 = 0;
      do {
        lVar5 = (long)(vertex->m_ei).m_a[lVar10];
        if (lVar5 < 0) {
          return false;
        }
        this_02 = (this->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.m_a
                  + lVar5;
        dVar13 = dVar14;
        pOVar6 = ON_CurveProxy::ProxyCurve(&this_02->super_ON_CurveProxy);
        if (pOVar6 == (ON_Curve *)0x0) {
          return false;
        }
        (*(this_02->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object.
          _vptr_ON_Object[0x25])(this_02);
        lVar5 = 0;
        bVar3 = true;
        local_68.m_t[1] = dVar13;
        do {
          bVar8 = bVar3;
          if (this_02->m_vi[lVar5] == iVar1) {
            pdVar7 = ON_Interval::operator[](&local_68,(int)lVar5);
            ON_Curve::PointAt(&local_48,(ON_Curve *)this_02,*pdVar7);
            dVar13 = ON_3dPoint::DistanceTo(this_00,&local_48);
            if (dVar14 < dVar13) {
              dVar14 = dVar13;
            }
          }
          lVar5 = 1;
          bVar3 = false;
        } while (bVar8);
        lVar5 = (long)(this_02->m_ti).m_count;
        if (0 < lVar5) {
          lVar9 = 0;
          do {
            uVar2 = (this_02->m_ti).m_a[lVar9];
            pOVar12 = (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>
                      .m_a;
            if (pOVar12 != (ON_BrepTrim *)0x0 &&
                ((int)uVar2 <
                 (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.
                 m_count && -1 < (int)uVar2)) {
              pOVar12 = pOVar12 + uVar2;
              pOVar6 = ON_BrepTrim::TrimCurveOf(pOVar12);
              if ((pOVar6 != (ON_Curve *)0x0) &&
                 (this_01 = ON_BrepTrim::SurfaceOf(pOVar12), this_01 != (ON_Surface *)0x0)) {
                lVar11 = 0;
                bVar3 = true;
                do {
                  bVar8 = bVar3;
                  if (this_02->m_vi[lVar11] == iVar1) {
                    dVar13 = dVar14;
                    (*(pOVar12->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.
                      super_ON_Object._vptr_ON_Object[0x25])(pOVar12);
                    local_58.m_t[1] = dVar13;
                    pdVar7 = ON_Interval::operator[]
                                       (&local_58,(uint)pOVar12->m_bRev3d ^ (uint)lVar11);
                    ON_Curve::PointAt(&local_48,(ON_Curve *)pOVar12,*pdVar7);
                    ON_Surface::PointAt(&local_48,this_01,local_48.x,local_48.y);
                    dVar13 = ON_3dPoint::DistanceTo(this_00,&local_48);
                    if (dVar14 < dVar13) {
                      dVar14 = dVar13;
                    }
                  }
                  lVar11 = 1;
                  bVar3 = false;
                } while (bVar8);
              }
            }
            lVar9 = lVar9 + 1;
          } while (lVar9 != lVar5);
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 != lVar4);
      dVar14 = (double)(~-(ulong)(dVar14 <= 2.3283064365386963e-10) & (ulong)(dVar14 * 1.001));
      vertex->m_tolerance = dVar14;
    }
  }
  return 0.0 <= dVar14;
}

Assistant:

bool
ON_Brep::SetVertexTolerance( ON_BrepVertex& vertex,
  bool bLazySet // default = false
                // false: recompute tolerance even if
                //        its current value is positive
                // true:  recompute tolerance only if
                //        its current value is nonpositive
  ) const
{
  if ( vertex.m_tolerance < 0.0 || !bLazySet ) {
    const int vertex_edge_count = vertex.EdgeCount();
    if ( vertex_edge_count < 1 ) {
      vertex.m_tolerance = 0.0;
    }
    else {
      vertex.m_tolerance = ON_UNSET_VALUE;
      double tolerance = 0.0;
      double d;
      ON_3dPoint uv;
      ON_Interval edge_domain;
      //const ON_Curve* c=0;
      const ON_Surface* s=0;
      int vei, ei, eti, endi;
      const int vertex_index = vertex.m_vertex_index;
      for ( vei = 0; vei < vertex_edge_count; vei++ ) 
      {
        ei = vertex.m_ei[vei];
        if ( ei < 0 )
          return false;
        const ON_BrepEdge& edge = m_E[ei];
        if ( !edge.ProxyCurve() )
          return false;
        edge_domain = edge.Domain();
        for ( endi = 0; endi < 2; endi++ )
        {
          if ( edge.m_vi[endi] == vertex_index ) 
          {
            d = vertex.point.DistanceTo( edge.PointAt(edge_domain[endi]) );
            if ( tolerance < d )
              tolerance = d;
          }
        }
        const int edge_trim_count = edge.m_ti.Count();
        for ( eti = 0; eti < edge_trim_count; eti++ ) 
        {
          const ON_BrepTrim* trim = Trim(edge.m_ti[eti]);
          if ( 0 == trim )
            continue;
          if ( 0 == trim->TrimCurveOf() )
            continue;
          s = trim->SurfaceOf();
          if ( 0 == s )
            continue;
          for ( endi = 0; endi < 2; endi++ ) {
            if ( edge.m_vi[endi] == vertex_index ) {
              uv = trim->PointAt( trim->Domain()[trim->m_bRev3d?1-endi:endi] );
              d = vertex.point.DistanceTo( s->PointAt(uv.x,uv.y) );
              if ( tolerance < d )
                tolerance = d;
            }
          }
        }
      }
      vertex.m_tolerance = (tolerance <= ON_ZERO_TOLERANCE) ? 0.0 : 1.001*tolerance;
    }
  }
  return (vertex.m_tolerance >= 0.0) ? true : false;
}